

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O0

string * pbrt::internal::ToString3<float>(float x,float y,float z)

{
  string *in_RDI;
  float *unaff_retaddr;
  float *in_stack_00000008;
  undefined4 in_stack_00000010;
  
  StringPrintf<float&,float&,float&>
            ((char *)CONCAT44(x,y),(float *)CONCAT44(z,in_stack_00000010),in_stack_00000008,
             unaff_retaddr);
  return in_RDI;
}

Assistant:

std::string internal::ToString3(T x, T y, T z) {
    if (std::is_floating_point<T>::value)
        return StringPrintf("[ %f, %f, %f ]", x, y, z);
    else
        return StringPrintf("[ %d, %d, %d ]", x, y, z);
}